

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O0

FxExpression * ParseRandom2(FScanner *sc,PClassActor *cls)

{
  FxExpression *m;
  FxExpression *r;
  bool bVar1;
  FxRandom2 *this;
  FScriptPosition local_38;
  FxExpression *local_28;
  FxExpression *mask;
  FRandom *rng;
  PClassActor *cls_local;
  FScanner *sc_local;
  
  rng = (FRandom *)cls;
  cls_local = (PClassActor *)sc;
  mask = (FxExpression *)ParseRNG(sc);
  local_28 = (FxExpression *)0x0;
  FScanner::MustGetToken((FScanner *)cls_local,0x28);
  bVar1 = FScanner::CheckToken((FScanner *)cls_local,0x29);
  if (!bVar1) {
    local_28 = ParseExpressionM((FScanner *)cls_local,(PClassActor *)rng);
    FScanner::MustGetToken((FScanner *)cls_local,0x29);
  }
  this = (FxRandom2 *)operator_new(0x48);
  r = mask;
  m = local_28;
  FScriptPosition::FScriptPosition(&local_38,(FScanner *)cls_local);
  FxRandom2::FxRandom2(this,(FRandom *)r,m,&local_38);
  FScriptPosition::~FScriptPosition(&local_38);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseRandom2(FScanner &sc, PClassActor *cls)
{
	FRandom *rng = ParseRNG(sc);
	FxExpression *mask = NULL;

	sc.MustGetToken('(');

	if (!sc.CheckToken(')'))
	{
		mask = ParseExpressionM(sc, cls);
		sc.MustGetToken(')');
	}
	return new FxRandom2(rng, mask, sc);
}